

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O0

void __thiscall el::Logger::flush(Logger *this)

{
  NoScopedLock<el::base::threading::internal::NoMutex> *in_RDI;
  EnumType lIndex;
  ScopedLock scopedLock;
  function<bool_()> *in_stack_ffffffffffffff88;
  function<bool_()> local_38;
  anon_class_16_2_455e6bc1 local_14;
  
  (*in_RDI->_vptr_NoScopedLock[2])();
  el::base::threading::internal::NoScopedLock<el::base::threading::internal::NoMutex>::NoScopedLock
            (in_RDI,(NoMutex *)in_stack_ffffffffffffff88);
  local_14.this._0_4_ = 2;
  std::function<bool()>::function<el::Logger::flush()::__0,void>(&local_38,&local_14);
  LevelHelper::forEachLevel((EnumType *)in_RDI,in_stack_ffffffffffffff88);
  el::base::utils::std::function<bool_()>::~function((function<bool_()> *)0x267ab9);
  el::base::threading::internal::NoScopedLock<el::base::threading::internal::NoMutex>::~NoScopedLock
            ((NoScopedLock<el::base::threading::internal::NoMutex> *)((long)&local_14.this + 4));
  return;
}

Assistant:

void Logger::flush(void) {
  ELPP_INTERNAL_INFO(3, "Flushing logger [" << m_id << "] all levels");
  base::threading::ScopedLock scopedLock(lock());
  base::type::EnumType lIndex = LevelHelper::kMinValid;
  LevelHelper::forEachLevel(&lIndex, [&](void) -> bool {
    flush(LevelHelper::castFromInt(lIndex), nullptr);
    return false;
  });
}